

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O0

string * __thiscall
cfd::core::DescriptorNode::ToString_abi_cxx11_
          (string *__return_storage_ptr__,DescriptorNode *this,bool append_checksum)

{
  bool bVar1;
  ulong uVar2;
  undefined1 local_168 [8];
  string checksum;
  string local_128;
  reference local_108;
  DescriptorNode *child;
  const_iterator __end4;
  const_iterator __begin4;
  vector<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_> *__range4;
  string child_text;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  CfdSourceLocation local_38;
  undefined1 local_1a;
  byte local_19;
  DescriptorNode *pDStack_18;
  bool append_checksum_local;
  DescriptorNode *this_local;
  string *result;
  
  local_1a = 0;
  local_19 = append_checksum;
  pDStack_18 = this;
  this_local = (DescriptorNode *)__return_storage_ptr__;
  ::std::__cxx11::string::string((string *)__return_storage_ptr__);
  local_38.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_descriptor.cpp"
               ,0x2f);
  local_38.filename = local_38.filename + 1;
  local_38.line = 0x7b7;
  local_38.funcname = "ToString";
  logger::info<std::__cxx11::string_const&,std::__cxx11::string_const&>
            (&local_38,"name={}, value={}",&this->name_,&this->value_);
  uVar2 = ::std::__cxx11::string::empty();
  if (((uVar2 & 1) != 0) ||
     (bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )this,"miniscript"), bVar1)) {
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&this->value_);
  }
  else {
    bVar1 = ::std::vector<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>::
            empty(&this->child_node_);
    if (bVar1) {
      ::std::operator+(&local_a8,&this->name_,"(");
      ::std::operator+(&local_88,&local_a8,&this->value_);
      ::std::operator+(&local_68,&local_88,")");
      ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_68);
      ::std::__cxx11::string::~string((string *)&local_68);
      ::std::__cxx11::string::~string((string *)&local_88);
      ::std::__cxx11::string::~string((string *)&local_a8);
    }
    else {
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&child_text.field_2 + 8),&this->name_,"(");
      ::std::__cxx11::string::operator=
                ((string *)__return_storage_ptr__,(string *)(child_text.field_2._M_local_buf + 8));
      ::std::__cxx11::string::~string((string *)(child_text.field_2._M_local_buf + 8));
      ::std::__cxx11::string::string((string *)&__range4);
      __end4 = ::std::vector<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
               ::begin(&this->child_node_);
      child = (DescriptorNode *)
              ::std::vector<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>::
              end(&this->child_node_);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end4,(__normal_iterator<const_cfd::core::DescriptorNode_*,_std::vector<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>_>
                                         *)&child), bVar1) {
        local_108 = __gnu_cxx::
                    __normal_iterator<const_cfd::core::DescriptorNode_*,_std::vector<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>_>
                    ::operator*(&__end4);
        uVar2 = ::std::__cxx11::string::empty();
        if ((uVar2 & 1) == 0) {
          ::std::__cxx11::string::operator+=((string *)&__range4,",");
        }
        ToString_abi_cxx11_(&local_128,local_108,true);
        ::std::__cxx11::string::operator+=((string *)&__range4,(string *)&local_128);
        ::std::__cxx11::string::~string((string *)&local_128);
        __gnu_cxx::
        __normal_iterator<const_cfd::core::DescriptorNode_*,_std::vector<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>_>
        ::operator++(&__end4);
      }
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&checksum.field_2 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &__range4,")");
      ::std::__cxx11::string::operator+=
                ((string *)__return_storage_ptr__,(string *)(checksum.field_2._M_local_buf + 8));
      ::std::__cxx11::string::~string((string *)(checksum.field_2._M_local_buf + 8));
      ::std::__cxx11::string::~string((string *)&__range4);
    }
  }
  if ((this->depth_ == 0) && ((local_19 & 1) != 0)) {
    GenerateChecksum((string *)local_168,__return_storage_ptr__);
    uVar2 = ::std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"#");
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)local_168);
    }
    ::std::__cxx11::string::~string((string *)local_168);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string DescriptorNode::ToString(bool append_checksum) const {
  std::string result;
  info(CFD_LOG_SOURCE, "name={}, value={}", name_, value_);

  if (name_.empty() || (name_ == "miniscript")) {
    result = value_;
  } else if (child_node_.empty()) {
    result = name_ + "(" + value_ + ")";
  } else {
    result = name_ + "(";
    std::string child_text;
    for (const auto& child : child_node_) {
      if (!child_text.empty()) child_text += ",";
      child_text += child.ToString();
    }
    result += child_text + ")";
  }

  if ((depth_ == 0) && append_checksum) {
    std::string checksum = GenerateChecksum(result);
    if (!checksum.empty()) {
      result += "#";
      result += checksum;
    }
  }
  return result;
}